

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<6,_2,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_3,_3> *mat;
  MatrixCaseUtils local_84 [12];
  VecAccess<float,_4,_3> local_78;
  MatrixCaseUtils local_60 [36];
  Matrix<float,_3,_3> local_3c;
  
  getInputValue<2,9>((Mat3 *)local_60,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  negate<float,3,3>(&local_3c,local_60,mat);
  reduceToVec3(local_84,&local_3c);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_84);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(negate(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}